

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoutils.c
# Opt level: O0

int nsdiffs(double *x,int N,int f,double *alpha,char *test,int *max_D)

{
  int iVar1;
  double *sig;
  double *oup;
  int local_74;
  double *local_70;
  double *z;
  double *y;
  double alpha_;
  int local_48;
  int dodiff;
  int NX;
  int cc;
  int max_D_;
  int D;
  int *max_D_local;
  char *test_local;
  double *alpha_local;
  int f_local;
  int N_local;
  double *x_local;
  
  cc = 0;
  if (alpha == (double *)0x0) {
    local_70 = (double *)0x3fa999999999999a;
  }
  else {
    local_70 = (double *)*alpha;
  }
  y = local_70;
  if (max_D == (int *)0x0) {
    local_74 = 1;
  }
  else {
    local_74 = *max_D;
  }
  if (local_74 < 0) {
    printf("Error. Maximum Difference cannot be less than 0 \n");
    exit(-1);
  }
  if ((double)local_70 < 0.01) {
    y = (double *)0x3f847ae147ae147b;
    printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.01. \n");
  }
  if (0.1 < (double)y) {
    y = (double *)0x3fb999999999999a;
    printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.1. \n");
  }
  iVar1 = strcmp(test,"ocsb");
  if ((iVar1 == 0) && (((double)y != 0.05 || (NAN((double)y))))) {
    printf(
          "Significance levels other than 5%% are not currently supported by test=\'ocsb\', defaulting to alpha = 0.05."
          );
  }
  iVar1 = checkConstant(x,N);
  if (iVar1 == 1) {
    x_local._4_4_ = 0;
  }
  else if (f < 2) {
    printf("Warning : Only data with f > 1 can be differenced. \n");
    x_local._4_4_ = 0;
  }
  else {
    alpha_._4_4_ = runseasonalitytests(x,N,f,test);
    sig = (double *)malloc((long)N << 3);
    oup = (double *)malloc((long)N << 3);
    memcpy(sig,x,(long)N << 3);
    local_48 = N;
    while (alpha_._4_4_ == 1 && cc < local_74) {
      cc = cc + 1;
      local_48 = diffs(sig,local_48,1,f,oup);
      iVar1 = checkConstant(oup,local_48);
      if (iVar1 == 1) break;
      alpha_._4_4_ = runseasonalitytests(oup,local_48,f,test);
      memcpy(sig,oup,(long)local_48 << 3);
    }
    free(sig);
    free(oup);
    x_local._4_4_ = cc;
  }
  return x_local._4_4_;
}

Assistant:

int nsdiffs(double *x, int N,int f,double *alpha, const char *test, int *max_D)  {
    int D,max_D_,cc,NX,dodiff;
    double alpha_;
    double *y,*z;

    D = 0;

    alpha_ = alpha == NULL ? 0.05 : *alpha;
    max_D_ = max_D == NULL ? 1 : *max_D;

    if (max_D_ < 0) {
        printf("Error. Maximum Difference cannot be less than 0 \n");
        exit(-1);
    } 

    if (alpha_ < 0.01) {
        alpha_ = 0.01;
        printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.01. \n");
    }

    if (alpha_ > 0.1) {
        alpha_ = 0.1;
        printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.1. \n");
    }

    if (!strcmp(test,"ocsb")) {
        if (alpha_ != 0.05) {
            printf("Significance levels other than 5%% are not currently supported by test='ocsb', defaulting to alpha = 0.05.");
            alpha_ = 0.05;
        }
    }

    cc = checkConstant(x,N);
    //printf("cc %d \n",cc);

    if (cc == 1) return D;

    NX = N;

    if (f <= 1) {
        printf("Warning : Only data with f > 1 can be differenced. \n");
        return 0;
    }

    dodiff = runseasonalitytests(x,N,f,test);

    y = (double*)malloc(sizeof(double)*NX);
    z = (double*)malloc(sizeof(double)*NX);

    memcpy(y,x,sizeof(double)*NX);

    while (dodiff == 1 && D < max_D_) {
        D++;
        NX = diffs(y,NX,1,f,z);

        cc = checkConstant(z,NX);

        //printf("cc %d \n",cc);

        if (cc == 1) break;

        dodiff = runseasonalitytests(z,NX,f,test);
        memcpy(y,z,sizeof(double)*NX);
    }

    free(y);
    free(z);

    return D;
}